

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::IsAddressFromAllocator
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,void *address)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar5;
  SegmentBase<Memory::VirtualAllocWrapper> *pSVar6;
  undefined8 *in_FS_OFFSET;
  undefined1 local_70 [8];
  Iterator decommitSegmentsIterator;
  Iterator segmentsIterator;
  Iterator fullSegmentsIterator;
  Iterator largeSegmentsIterator;
  
  decommitSegmentsIterator.current =
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).segments.super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  segmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       decommitSegmentsIterator.current;
  while( true ) {
    if (segmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_00277c12;
      *puVar1 = 0;
    }
    segmentsIterator.list =
         ((segmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (segmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        decommitSegmentsIterator.current) break;
    pPVar5 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&decommitSegmentsIterator.current);
    bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,pPVar5);
    if (bVar3) {
      return true;
    }
  }
  segmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  segmentsIterator.current =
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).fullSegments.super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       segmentsIterator.current;
  while( true ) {
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_00277c12;
      *puVar1 = 0;
    }
    fullSegmentsIterator.list =
         ((fullSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        segmentsIterator.current) break;
    pPVar5 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&segmentsIterator.current);
    bVar3 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,pPVar5);
    if (bVar3) {
      return true;
    }
  }
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  fullSegmentsIterator.current =
       (NodeBase *)
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).largeSegments;
  largeSegmentsIterator.list =
       (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       fullSegmentsIterator.current;
  while( true ) {
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_00277c12;
      *puVar1 = 0;
    }
    largeSegmentsIterator.list =
         ((largeSegmentsIterator.list)->
         super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        fullSegmentsIterator.current) break;
    pSVar6 = DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Data
                       ((Iterator *)&fullSegmentsIterator.current);
    if ((pSVar6->address <= address) &&
       (address < pSVar6->address +
                  (pSVar6->segmentPageCount - (ulong)pSVar6->secondaryAllocPageCount) * 0x1000)) {
      return true;
    }
  }
  local_70 = (undefined1  [8])
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).decommitSegments;
  decommitSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)local_70;
  do {
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
LAB_00277c12:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    decommitSegmentsIterator.list =
         ((decommitSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    bVar3 = (undefined1  [8])decommitSegmentsIterator.list != local_70;
    if ((undefined1  [8])decommitSegmentsIterator.list == local_70) {
      return bVar3;
    }
    pPVar5 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)local_70);
    bVar4 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::IsAddressInSegment
                      (&this->
                        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       ,address,pPVar5);
    if (bVar4) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool
HeapPageAllocator<T>::IsAddressFromAllocator(__in void* address)
{
    typename DListBase<PageSegmentBase<T>>::Iterator segmentsIterator(&this->segments);
    while (segmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, segmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator fullSegmentsIterator(&this->fullSegments);
    while (fullSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, fullSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<SegmentBase<T>>::Iterator largeSegmentsIterator(&this->largeSegments);
    while (largeSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, largeSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator decommitSegmentsIterator(&this->decommitSegments);
    while (decommitSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, decommitSegmentsIterator.Data()))
        {
            return true;
        }
    }

    return false;
}